

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

void Lf_ManCountMapRefsOne(Lf_Man_t *p,int iObj)

{
  word *pwVar1;
  int iVar2;
  int iVar3;
  Lf_Bst_t *pLVar4;
  int *piVar5;
  Jf_Par_t *pJVar6;
  Lf_Cut_t *pLVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  float fVar12;
  double dVar13;
  
  if ((-1 < iObj) && (iObj < (p->vOffsets).nSize)) {
    pLVar4 = p->pObjBests;
    iVar2 = (p->vOffsets).pArray[(uint)iObj];
    pLVar7 = Lf_ObjCutBest(p,iObj);
    if ((iObj < (p->vRequired).nSize) && (iObj < (p->vOffsets).nSize)) {
      iVar3 = (p->vOffsets).pArray[(uint)iObj];
      if ((-1 < (long)iVar3) && (iVar3 < (p->vMapRefs).nSize)) {
        if ((p->vMapRefs).pArray[iVar3] < 1) {
          __assert_fail("Lf_ObjMapRefNum(p, iObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                        ,0x62e,"void Lf_ManCountMapRefsOne(Lf_Man_t *, int)");
        }
        if ((((uint)pLVar4[iVar2].Cut[1] ^ (uint)pLVar4[iVar2].Cut[0]) & 1) == 0) {
          __assert_fail("Lf_BestIsMapped(pBest)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                        ,0x62f,"void Lf_ManCountMapRefsOne(Lf_Man_t *, int)");
        }
        if ((pLVar7->field_0x16 & 0x80) != 0) {
          __assert_fail("!pCut->fMux7",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                        ,0x630,"void Lf_ManCountMapRefsOne(Lf_Man_t *, int)");
        }
        if (*(uint *)&pLVar7->field_0x14 < 0x1000000) {
          uVar8 = (ulong)(*(uint *)&pLVar7->field_0x14 >> 0x18);
          bVar11 = true;
        }
        else {
          piVar5 = (p->vRequired).pArray;
          iVar2 = piVar5[(uint)iObj];
          uVar10 = 0;
          do {
            iVar3 = *(int *)((long)&pLVar7[1].Sign + uVar10 * 4);
            lVar9 = (long)iVar3;
            if ((lVar9 < 0) || ((p->vRequired).nSize <= iVar3)) goto LAB_006d69b0;
            if (iVar2 <= piVar5[lVar9]) {
              piVar5[lVar9] = iVar2 + -1;
            }
            uVar10 = uVar10 + 1;
            uVar8 = (ulong)(*(uint *)&pLVar7->field_0x14 >> 0x18);
          } while (uVar10 < uVar8);
          bVar11 = *(uint *)&pLVar7->field_0x14 < 0x1000000;
        }
        if ((p->vSwitches).nSize != 0) {
          dVar13 = 0.0;
          if (!bVar11) {
            fVar12 = 0.0;
            uVar10 = 0;
            do {
              iVar2 = *(int *)((long)&pLVar7[1].Sign + uVar10 * 4);
              if (((long)iVar2 < 0) || ((p->vSwitches).nSize <= iVar2)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                              ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
              }
              fVar12 = fVar12 + (p->vSwitches).pArray[iVar2];
              uVar10 = uVar10 + 1;
            } while (uVar8 != uVar10);
            dVar13 = (double)fVar12;
          }
          p->Switches = dVar13 + p->Switches;
        }
        pJVar6 = p->pPars;
        pwVar1 = &pJVar6->Edge;
        *pwVar1 = *pwVar1 + (ulong)(byte)pLVar7->field_0x17;
        pwVar1 = &pJVar6->Area;
        *pwVar1 = *pwVar1 + 1;
        return;
      }
    }
  }
LAB_006d69b0:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Lf_ManCountMapRefsOne( Lf_Man_t * p, int iObj )
{
    Lf_Bst_t * pBest = Lf_ObjReadBest( p, iObj );
    Lf_Cut_t * pCut = Lf_ObjCutBest( p, iObj );
    int k ,Required = Lf_ObjRequired( p, iObj );
    assert( Lf_ObjMapRefNum(p, iObj) > 0 );
    assert( Lf_BestIsMapped(pBest) );
    assert( !pCut->fMux7 );
//    assert( pCut->Delay <= Required );
    for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Lf_ObjSetRequired( p, pCut->pLeaves[k], Required - 1 );
    if ( Vec_FltSize(&p->vSwitches) )
        p->Switches += Lf_CutSwitches(p, pCut);
    p->pPars->Edge += pCut->nLeaves;
    p->pPars->Area++;
}